

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

void Sfm_TimStop(Sfm_Tim_t *p)

{
  int *piVar1;
  void *__ptr;
  word *__ptr_00;
  int iVar2;
  Vec_Int_t *__ptr_01;
  long lVar3;
  long lVar4;
  
  piVar1 = (p->vTimArrs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTimArrs).pArray = (int *)0x0;
  }
  (p->vTimArrs).nCap = 0;
  (p->vTimArrs).nSize = 0;
  piVar1 = (p->vTimReqs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTimReqs).pArray = (int *)0x0;
  }
  (p->vTimReqs).nCap = 0;
  (p->vTimReqs).nSize = 0;
  iVar2 = (p->vLevels).nCap;
  __ptr_01 = (p->vLevels).pArray;
  if (iVar2 < 1) {
    if (__ptr_01 == (Vec_Int_t *)0x0) goto LAB_004c59fb;
  }
  else {
    lVar3 = 8;
    lVar4 = 0;
    do {
      __ptr = *(void **)((long)&__ptr_01->nCap + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        __ptr_01 = (p->vLevels).pArray;
        *(undefined8 *)((long)&__ptr_01->nCap + lVar3) = 0;
        iVar2 = (p->vLevels).nCap;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < iVar2);
  }
  free(__ptr_01);
  (p->vLevels).pArray = (Vec_Int_t *)0x0;
LAB_004c59fb:
  (p->vLevels).nCap = 0;
  (p->vLevels).nSize = 0;
  piVar1 = (p->vPath).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vPath).pArray = (int *)0x0;
  }
  (p->vPath).nCap = 0;
  (p->vPath).nSize = 0;
  __ptr_00 = (p->vSortData).pArray;
  if (__ptr_00 != (word *)0x0) {
    free(__ptr_00);
  }
  free(p);
  return;
}

Assistant:

void Sfm_TimStop( Sfm_Tim_t * p )
{
    Vec_IntErase( &p->vTimArrs );
    Vec_IntErase( &p->vTimReqs );
    Vec_WecErase( &p->vLevels );
    Vec_IntErase( &p->vPath );
    Vec_WrdErase( &p->vSortData );
    ABC_FREE( p );
}